

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  vec<Minisat::Solver::watchItem> *this_00;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this_01;
  uint64_t *puVar1;
  ulong *puVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  uint *puVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  vec<Minisat::Watcher> *this_02;
  Watcher *pWVar10;
  Watcher *pWVar11;
  ulong uVar12;
  Lit LVar13;
  byte bVar14;
  uint uVar15;
  Watcher *pWVar16;
  undefined8 *puVar17;
  int nInd;
  int iVar18;
  long lVar19;
  ulong uVar20;
  vec<Minisat::Watcher> *pvVar21;
  int k;
  Watcher *pWVar22;
  long lVar23;
  uint local_b4;
  watchItem local_b0;
  uint local_a4;
  Watcher w;
  uint local_84;
  int local_80;
  
  if ((this->lazySATwatch).data != (watchItem *)0x0) {
    (this->lazySATwatch).sz = 0;
  }
  this_00 = &this->lazySATwatch;
  this_01 = &this->watches;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll(this_01)
  ;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (&this->watches_bin);
  local_84 = 0xffffffff;
  iVar18 = 0;
  uVar15 = 0xfffffffe;
LAB_001161ac:
  iVar3 = this->qhead;
  if ((this->trail).sz <= iVar3) {
LAB_00116892:
    lVar19 = 0;
    for (lVar23 = 0; lVar23 < (this->lazySATwatch).sz; lVar23 = lVar23 + 1) {
      vec<Minisat::Watcher>::push
                ((this_01->occs).data + *(int *)((long)&(this_00->data->l).x + lVar19),
                 (Watcher *)((long)&(this_00->data->w).cref + lVar19));
      lVar19 = lVar19 + 0xc;
    }
    this->propagations = this->propagations + (long)iVar18;
    this->simpDB_props = this->simpDB_props - (long)iVar18;
    return local_84;
  }
  this->qhead = iVar3 + 1;
  uVar4 = (this->trail).data[iVar3].x;
  iVar3 = (this->vardata).data[(int)uVar4 >> 1].level;
  this_02 = (this->watches).occs.data + (int)uVar4;
  iVar18 = iVar18 + 1;
  local_b4 = uVar15;
  local_a4 = uVar4;
  if (this->use_backuped_trail == true) {
    iVar8 = this->old_trail_qhead;
    iVar9 = (this->old_trail).sz;
    if (iVar8 < iVar9) {
      uVar15 = (this->old_trail).data[iVar8].x;
    }
    local_b4 = 0xfffffffe;
    if (uVar15 != 0xfffffffe) {
      local_b4 = uVar4;
      if (uVar4 == uVar15) {
        while (iVar8 < iVar9 + -1) {
          this->old_trail_qhead = iVar8 + 1;
          local_b4 = (this->old_trail).data[(long)iVar8 + 1].x;
          iVar8 = (int)local_b4 >> 1;
          uVar15 = (this->oldreasons).data[iVar8];
          uVar20 = (ulong)uVar15;
          if (uVar20 == 0xffffffff) break;
          bVar14 = (byte)local_b4 & 1;
          local_b0.w.cref._0_1_ = (this->assigns).data[iVar8].value ^ bVar14;
          bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x1);
          if (bVar7) {
            puVar6 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            if (((*(ulong *)(puVar6 + uVar20) & 0xfffffffc00000000) != 0x800000000) &&
               (puVar6[uVar20 + 2] != local_b4)) goto LAB_001163bd;
            this->used_backup_lits = this->used_backup_lits + 1;
            local_84 = uVar15;
            goto LAB_00116892;
          }
          local_b0.w.cref._0_1_ = bVar14 ^ (this->assigns).data[iVar8].value;
          bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x2);
          if (bVar7) {
            puVar6 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            if (((*(ulong *)(puVar6 + uVar20) & 0xfffffffc00000000) != 0x800000000) &&
               (puVar6[uVar20 + 2] != local_b4)) goto LAB_001163bd;
            this->used_backup_lits = this->used_backup_lits + 1;
            uncheckedEnqueue(this,(Lit)local_b4,(this->trail_lim).sz,uVar15);
          }
          iVar9 = (this->old_trail).sz;
          iVar8 = this->old_trail_qhead;
        }
      }
      else {
        local_b4 = uVar15;
        if ((int)uVar4 >> 1 != (int)uVar15 >> 1) {
          local_b0.w.cref._0_1_ = (byte)uVar15 & 1 ^ (this->assigns).data[(int)uVar15 >> 1].value;
          bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x1);
          if (!bVar7) goto LAB_001163c5;
        }
LAB_001163bd:
        reset_old_trail(this);
      }
    }
  }
LAB_001163c5:
  pvVar21 = (this->watches_bin).occs.data + (int)uVar4;
  for (lVar19 = 0; lVar19 < pvVar21->sz; lVar19 = lVar19 + 1) {
    LVar13.x = pvVar21->data[lVar19].blocker.x;
    bVar14 = (byte)LVar13.x & 1;
    local_b0.w.cref._0_1_ = (this->assigns).data[LVar13.x >> 1].value ^ bVar14;
    bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x1);
    if (bVar7) {
      local_84 = pvVar21->data[lVar19].cref;
      goto LAB_00116892;
    }
    local_b0.w.cref._0_1_ = bVar14 ^ (this->assigns).data[LVar13.x >> 1].value;
    bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x2);
    if (bVar7) {
      uncheckedEnqueue(this,LVar13,iVar3,pvVar21->data[lVar19].cref);
    }
  }
  pWVar22 = this_02->data;
  pWVar10 = pWVar22 + this_02->sz;
  local_a4 = local_a4 ^ 1;
  pWVar16 = pWVar22;
  do {
    while( true ) {
      lVar19 = 0;
      while( true ) {
        pWVar11 = (Watcher *)((long)&pWVar22->cref + lVar19);
        if (pWVar11 == pWVar10) {
          vec<Minisat::Watcher>::shrink
                    (this_02,(int)((ulong)((long)pWVar10 + (-lVar19 - (long)pWVar16)) >> 3));
          uVar15 = local_b4;
          goto LAB_001161ac;
        }
        iVar8 = *(int *)((long)&(pWVar22->blocker).x + lVar19);
        local_b0.w.cref._0_1_ = (byte)iVar8 & 1 ^ (this->assigns).data[iVar8 >> 1].value;
        bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x0);
        if (!bVar7) break;
        *(Watcher *)((long)&pWVar16->cref + lVar19) = *pWVar11;
        lVar19 = lVar19 + 8;
      }
      uVar15 = *(uint *)((long)&pWVar22->cref + lVar19);
      puVar6 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      puVar1 = &(this->statistics).solveSteps;
      *puVar1 = *puVar1 + 1;
      puVar2 = (ulong *)(puVar6 + uVar15);
      LVar13.x = (int)puVar2[1];
      if (LVar13.x == local_a4) {
        LVar13.x = *(int *)((long)puVar2 + 0xc);
        *(int *)(puVar2 + 1) = LVar13.x;
        *(uint *)((long)puVar2 + 0xc) = local_a4;
      }
      pWVar22 = (Watcher *)((long)&pWVar22[1].cref + lVar19);
      w.cref = uVar15;
      w.blocker.x = LVar13.x;
      if (LVar13.x != iVar8) break;
LAB_00116573:
      pWVar11 = (Watcher *)((long)&pWVar16->cref + lVar19);
      iVar8 = (this->assumptions).sz;
      local_80 = 0;
      for (uVar20 = 2; uVar20 < *puVar2 >> 0x22; uVar20 = uVar20 + 1) {
        local_b0.w.cref._0_1_ =
             (byte)puVar6[(ulong)uVar15 + uVar20 + 2] & 1 ^
             (this->assigns).data[(int)puVar6[(ulong)uVar15 + uVar20 + 2] >> 1].value;
        bVar7 = lbool::operator!=((lbool *)&local_b0,(lbool)0x1);
        if ((bVar7) &&
           (local_80 = (int)uVar20,
           iVar8 < (this->vardata).data[(int)puVar6[(ulong)uVar15 + uVar20 + 2] >> 1].level))
        goto LAB_00116699;
      }
      if (local_80 == 0) {
        puVar17 = (undefined8 *)((long)&pWVar16->cref + lVar19);
        pWVar16 = (Watcher *)(puVar17 + 1);
        *puVar17 = CONCAT44(w.blocker.x,w.cref);
        local_b0.w.cref._0_1_ = (byte)LVar13.x & 1 ^ (this->assigns).data[LVar13.x >> 1].value;
        bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x1);
        if (bVar7) {
          this->qhead = (this->trail).sz;
          for (; local_84 = uVar15, pWVar22 < pWVar10; pWVar22 = pWVar22 + 1) {
            *pWVar16 = *pWVar22;
            pWVar16 = pWVar16 + 1;
          }
        }
        else {
          iVar8 = iVar3;
          if (iVar3 != (this->trail_lim).sz) {
            uVar12 = 1;
            for (uVar20 = 2; uVar20 < *(ulong *)(puVar6 + uVar15) >> 0x22; uVar20 = uVar20 + 1) {
              iVar9 = (this->vardata).data[(int)puVar6[(ulong)uVar15 + uVar20 + 2] >> 1].level;
              if (iVar8 < iVar9) {
                uVar12 = uVar20;
                iVar8 = iVar9;
              }
              uVar12 = uVar12 & 0xffffffff;
            }
            iVar9 = (int)uVar12;
            if (iVar9 != 1) {
              uVar5 = *(undefined4 *)((long)puVar2 + 0xc);
              *(undefined4 *)((long)puVar2 + 0xc) =
                   *(undefined4 *)((long)puVar2 + (long)iVar9 * 4 + 8);
              *(undefined4 *)((long)puVar2 + (long)iVar9 * 4 + 8) = uVar5;
              local_b0.w.cref._0_1_ =
                   (byte)*(int *)((long)puVar2 + 0xc) & 1 ^
                   (this->assigns).data[*(int *)((long)puVar2 + 0xc) >> 1].value;
              bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x0);
              if (bVar7) {
                local_b0.l.x = *(uint *)((long)puVar2 + 0xc) ^ 1;
                local_b0.w.blocker.x = w.blocker.x;
                local_b0.w.cref = w.cref;
                vec<Minisat::Solver::watchItem>::push(this_00,&local_b0);
                pWVar16 = pWVar11;
              }
              else {
                vec<Minisat::Watcher>::push
                          ((this_01->occs).data + ((long)*(int *)((long)puVar2 + 0xc) ^ 1),&w);
                pWVar16 = pWVar11;
              }
            }
          }
          uncheckedEnqueue(this,LVar13,iVar8,uVar15);
        }
      }
      else {
LAB_00116699:
        *(undefined4 *)((long)puVar2 + 0xc) = *(undefined4 *)((long)puVar2 + (long)local_80 * 4 + 8)
        ;
        *(uint *)((long)puVar2 + (long)local_80 * 4 + 8) = local_a4;
        local_b0.w.cref._0_1_ =
             (byte)*(int *)((long)puVar2 + 0xc) & 1 ^
             (this->assigns).data[*(int *)((long)puVar2 + 0xc) >> 1].value;
        bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x0);
        if (bVar7) {
          local_b0.l.x = *(uint *)((long)puVar2 + 0xc) ^ 1;
          local_b0.w.blocker.x = w.blocker.x;
          local_b0.w.cref = w.cref;
          vec<Minisat::Solver::watchItem>::push(this_00,&local_b0);
          pWVar16 = pWVar11;
        }
        else {
          vec<Minisat::Watcher>::push
                    ((this_01->occs).data + ((long)*(int *)((long)puVar2 + 0xc) ^ 1),&w);
          pWVar16 = pWVar11;
        }
      }
    }
    local_b0.w.cref._0_1_ = (byte)LVar13.x & 1 ^ (this->assigns).data[LVar13.x >> 1].value;
    bVar7 = lbool::operator==((lbool *)&local_b0,(lbool)0x0);
    if (!bVar7) goto LAB_00116573;
    puVar17 = (undefined8 *)((long)&pWVar16->cref + lVar19);
    *puVar17 = CONCAT44(w.blocker.x,w.cref);
    pWVar16 = (Watcher *)(puVar17 + 1);
  } while( true );
}

Assistant:

CRef Solver::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    lazySATwatch.clear();
    Lit old_trail_top = lit_Undef;
    CRef old_reason = CRef_Undef;
    watches.cleanAll();
    watches_bin.cleanAll();

    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        int currLevel = level(var(p));
        vec<Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;

        /* begin old trail reconstruction */
        if (use_backuped_trail) {
            if (old_trail_qhead < old_trail.size()) {
                old_trail_top = old_trail[old_trail_qhead];
                old_reason = oldreasons[var(old_trail_top)];
            }
            if (old_trail_top != lit_Undef) {
                if (p == old_trail_top) {
                    while (old_trail_qhead < old_trail.size() - 1) {
                        old_trail_qhead++;
                        old_trail_top = old_trail[old_trail_qhead];
                        old_reason = oldreasons[var(old_trail_top)];
                        if (old_reason == CRef_Undef) {
                            break;
                        } else if (value(old_trail_top) == l_False) {
                            const Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will hit a conflict here, the clause is just not structured correctly yet,
                                nor watched correctly. */
                                reset_old_trail();
                                break;
                            }
                            confl = old_reason;
                            used_backup_lits++;
                            TRACE(std::cout
                                  << "c prop: hit conflict during trail restoring, when trying to propagate literal "
                                  << old_trail_top << " with reason[" << old_reason << "] " << new_conflict << std::endl;);
                            assert((new_conflict.size() == 2 || new_conflict[0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            /* No need to touch watch lists, we will backtrack this level anyways! */
                            goto propagation_out;
                        } else if (value(old_trail_top) == l_Undef) {
                            Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will use this unit clause, the clause is just not structured correctly yet */
                                reset_old_trail();
                                break;
                            }
                            used_backup_lits++;
                            TRACE(std::cout << "c prop: enqueue literal " << old_trail_top << " with reason["
                                            << old_reason << "] " << ca[old_reason] << std::endl;);
                            assert((ca[old_reason].size() == 2 || ca[old_reason][0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            uncheckedEnqueue(old_trail_top, decisionLevel(), old_reason);
                        }
                    }
                } else if (var(p) == var(old_trail_top) || value(old_trail_top) == l_False) {
                    reset_old_trail();
                }
            }
        }
        /* end old trail reconstruction */

        vec<Watcher> &ws_bin = watches_bin[p]; // Propagate binary clauses first.
        for (int k = 0; k < ws_bin.size(); k++) {
            Lit the_other = ws_bin[k].blocker;
            if (value(the_other) == l_False) {
                confl = ws_bin[k].cref;
                goto propagation_out;
            } else if (value(the_other) == l_Undef) {
                uncheckedEnqueue(the_other, currLevel, ws_bin[k].cref);
#ifdef PRINT_OUT
                std::cout << "i " << the_other << " l " << currLevel << "\n";
#endif
            }
        }

        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            statistics.solveSteps++;
            const Lit false_lit = ~p;
            if (c[0] == false_lit) c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            const Lit first = c[0];
            const Watcher w = Watcher(cr, first);
            if (first != blocker && value(first) == l_True) {
                *j++ = w;
                continue;
            }

            // Look for new watch:
            int watchPos = 0, avoidLevel = assumptions.size();
            for (int k = 2; k < c.size(); k++) {
                if (value(c[k]) != l_False) {
                    watchPos = k; /* memorize that we found one literal we can watch */
                    if (level(var(c[k])) > avoidLevel) break;
                }
            }

            /* found a position to watch, watch the clause */
            if (watchPos != 0) {
                c[1] = c[watchPos];
                c[watchPos] = false_lit;
                if (value(c[1]) == l_True) {
                    lazySATwatch.push(watchItem(w, ~c[1]));
                } else {
                    watches[~c[1]].push(w);
                }
                goto NextClause;
            }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) *j++ = *i++;
            } else {
                if (currLevel == decisionLevel()) {
                    uncheckedEnqueue(first, currLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << currLevel << "\n";
#endif
                } else {
                    int nMaxLevel = currLevel;
                    int nMaxInd = 1;
                    // pass over all the literals in the clause and find the one with the biggest level
                    for (int nInd = 2; nInd < c.size(); ++nInd) {
                        int nLevel = level(var(c[nInd]));
                        if (nLevel > nMaxLevel) {
                            nMaxLevel = nLevel;
                            nMaxInd = nInd;
                        }
                    }

                    if (nMaxInd != 1) {
                        std::swap(c[1], c[nMaxInd]);
                        j--; // undo last watch
                        if (value(c[1]) == l_True) {
                            lazySATwatch.push(watchItem(w, ~c[1]));
                        } else {
                            watches[~c[1]].push(w);
                        }
                    }

                    uncheckedEnqueue(first, nMaxLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << nMaxLevel << "\n";
#endif
                }
            }

        NextClause:;
        }
        ws.shrink(i - j);
    }

propagation_out:;
    /* we still need to re-add the satisfied clauses to their respective watch lists - in order! */
    for (int k = 0; k < lazySATwatch.size(); ++k) {
        watches[lazySATwatch[k].l].push(lazySATwatch[k].w);
    }

    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}